

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O2

bool BASELINE::baseline_enabled(example *ec)

{
  float *pfVar1;
  unsigned_long *puVar2;
  
  pfVar1 = (ec->super_example_predict).feature_space[0x89].values._begin;
  puVar2 = (ec->super_example_predict).feature_space[0x89].indicies._begin;
  while( true ) {
    if (pfVar1 == (ec->super_example_predict).feature_space[0x89].values._end) {
      return false;
    }
    if (*puVar2 == 0x54d) break;
    pfVar1 = pfVar1 + 1;
    puVar2 = puVar2 + 1;
  }
  return (bool)(-(*pfVar1 == 1.0) & 1);
}

Assistant:

iterator begin() { return iterator(values.begin(), indicies.begin()); }